

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  long *plVar1;
  pointer *pppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator __position;
  cmGlobalGenerator *pcVar4;
  cmGeneratorTarget *this_00;
  cmake *pcVar5;
  string *psVar6;
  byte bVar7;
  bool bVar8;
  TargetType TVar9;
  int iVar10;
  PolicyStatus PVar11;
  undefined8 *puVar12;
  string *psVar13;
  ostream *poVar14;
  undefined7 extraout_var;
  string *c;
  pointer name;
  uint uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBP;
  ulong uVar17;
  pointer ppcVar18;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar19;
  string expectedTargets;
  cmGeneratorTarget *te;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  ostringstream e;
  string local_280;
  uint local_25c;
  ostream *local_258;
  cmGeneratorTarget *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string *local_208;
  string local_200;
  vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *local_1e0;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  undefined8 uVar16;
  
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_allocated_capacity =
       local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_258 = os;
  GetTargets(this,&local_1c8);
  local_208 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_25c = CONCAT31(local_25c._1_3_,
                       local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start ==
                       local_1c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if (local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1d0 = &(this->super_cmExportFileGenerator).Namespace;
    local_1d8 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 *)&(this->super_cmExportFileGenerator).ExportedTargets;
    local_1e0 = (vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&this->Exports;
    unaff_RBP = &local_228;
    name = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_250 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,name);
      std::operator+(unaff_RBP,&local_248,local_1d0);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_200,local_250);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar16 = local_228.field_2._M_allocated_capacity;
      }
      uVar17 = (long)(_func_int ***)local_200._M_string_length + local_228._M_string_length;
      if ((ulong)uVar16 < uVar17) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          uVar16 = local_200.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < uVar17) goto LAB_002e18ce;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_200,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
      }
      else {
LAB_002e18ce:
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)unaff_RBP,(ulong)local_200._M_dataplus._M_p);
      }
      local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
      plVar1 = puVar12 + 2;
      if ((_Base_ptr *)*puVar12 == (_Base_ptr *)plVar1) {
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar1;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar12[3];
      }
      else {
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar1;
        local_1a8[0]._M_impl._0_8_ = (_Base_ptr *)*puVar12;
      }
      local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar12[1];
      *puVar12 = plVar1;
      puVar12[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::_M_append((char *)&local_280,local_1a8[0]._M_impl._0_8_);
      if ((_Base_ptr *)local_1a8[0]._M_impl._0_8_ !=
          &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_1a8[0]._M_impl._0_8_,
                        (ulong)((long)&(local_1a8[0]._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_248,0,(char *)local_248._M_string_length,0x4adeb1);
      pVar19 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>(local_1d8,&local_250);
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given target \"",0xe);
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(local_250);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar13->_M_dataplus)._M_p,
                             psVar13->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" more than once.",0x11);
        pcVar5 = this->LG->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmMakefile::GetBacktrace(this->LG->Makefile);
        cmake::IssueMessage(pcVar5,FATAL_ERROR,unaff_RBP,(cmListFileBacktrace *)&local_200);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        __position._M_current =
             (this->Exports).
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Exports).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
          _M_realloc_insert<cmGeneratorTarget*const&>(local_1e0,__position,&local_250);
        }
        else {
          *__position._M_current = local_250;
          pppcVar2 = &(this->Exports).
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppcVar2 = *pppcVar2 + 1;
        }
        TVar9 = cmGeneratorTarget::GetType(local_250);
        if (TVar9 == OBJECT_LIBRARY) {
          pcVar4 = this->LG->GlobalGenerator;
          iVar10 = (*pcVar4->_vptr_cmGlobalGenerator[0x25])(pcVar4,0);
          bVar7 = (byte)iVar10 ^ 1;
          TVar9 = (uint)bVar7 + (uint)bVar7 * 2 + OBJECT_LIBRARY;
        }
        if (TVar9 == INTERFACE_LIBRARY) {
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                    (this,local_258,"3.0.0");
        }
      }
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_002e1b9a;
      name = name + 1;
      local_25c = CONCAT31(local_25c._1_3_,name == local_208);
    } while (name != local_208);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,local_258,&local_280)
  ;
LAB_002e1b9a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  if ((local_25c & 1) == 0) {
    bVar7 = 0;
  }
  else {
    local_248._M_dataplus._M_p = (pointer)0x0;
    local_248._M_string_length = 0;
    local_248.field_2._M_allocated_capacity = 0;
    ppcVar18 = (this->Exports).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_208 = (string *)
                (this->Exports).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    uVar16 = CONCAT71((int7)((ulong)unaff_RBP >> 8),(string *)ppcVar18 == local_208);
    uVar15 = (uint)uVar16;
    if ((string *)ppcVar18 != local_208) {
      do {
        this_00 = *ppcVar18;
        TVar9 = cmGeneratorTarget::GetType(this_00);
        paVar3 = &local_280.field_2;
        if (TVar9 == OBJECT_LIBRARY) {
          pcVar4 = this->LG->GlobalGenerator;
          (*pcVar4->_vptr_cmGlobalGenerator[0x25])(pcVar4,0);
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                  (this,local_258,this_00);
        cmTarget::AppendBuildInterfaceIncludes(this_00->Target);
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_280._M_dataplus._M_p = (pointer)paVar3;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"INTERFACE_SOURCES","")
        ;
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_LINK_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_LINK_DEPENDS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_280,this_00,
                   (ImportPropertyMap *)local_1a8);
        local_25c = (uint)uVar16;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar3) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        local_280._M_string_length = 0;
        local_280.field_2._M_local_buf[0] = '\0';
        local_280._M_dataplus._M_p = (pointer)paVar3;
        bVar8 = cmExportFileGenerator::PopulateExportProperties
                          (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8
                           ,&local_280);
        uVar17 = CONCAT71(extraout_var,bVar8) & 0xffffffff;
        if (bVar8) {
          PVar11 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
          if (PVar11 != WARN) {
            PVar11 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
            if (PVar11 != OLD) {
              cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                        (&this->super_cmExportFileGenerator,this_00,BuildInterface,
                         (ImportPropertyMap *)local_1a8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_248);
            }
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,this_00,local_258,local_1a8);
        }
        else {
          pcVar5 = this->LG->GlobalGenerator->CMakeInstance;
          cmMakefile::GetBacktrace(this->LG->Makefile);
          cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_280,(cmListFileBacktrace *)&local_228);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                   local_280.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_1a8);
        if ((char)uVar17 == '\0') goto LAB_002e2147;
        ppcVar18 = ppcVar18 + 1;
        uVar16 = CONCAT71((int7)(uVar17 >> 8),(string *)ppcVar18 == local_208);
        uVar15 = (uint)uVar16;
      } while ((string *)ppcVar18 != local_208);
    }
    psVar13 = (this->super_cmExportFileGenerator).Configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar13 != psVar6) {
      do {
        cmExportFileGenerator::GenerateImportConfig
                  (&this->super_cmExportFileGenerator,local_258,psVar13,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        psVar13 = psVar13 + 1;
      } while (psVar13 != psVar6);
    }
    local_25c = uVar15;
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
              (this,local_258,&local_248);
LAB_002e2147:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
    bVar7 = (byte)local_25c;
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    this->GetTargets(targets);
    for (std::string const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      if (this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY) {
        this->GenerateRequiredCMakeVersion(os, "3.0.0");
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  std::vector<std::string> missingTargets;

  // Create all the imported targets.
  for (cmGeneratorTarget* gte : this->Exports) {
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties,
        missingTargets);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c, missingTargets);
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return true;
}